

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandQueueExecuteCommandLists
          (ze_command_queue_handle_t hCommandQueue,uint32_t numCommandLists,
          ze_command_list_handle_t *phCommandLists,ze_fence_handle_t hFence)

{
  ze_pfnCommandQueueExecuteCommandLists_t pfnExecuteCommandLists;
  ze_result_t result;
  ze_fence_handle_t hFence_local;
  ze_command_list_handle_t *phCommandLists_local;
  uint32_t numCommandLists_local;
  ze_command_queue_handle_t hCommandQueue_local;
  
  pfnExecuteCommandLists._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c328 != (code *)0x0) {
    pfnExecuteCommandLists._4_4_ =
         (*DAT_0011c328)(hCommandQueue,numCommandLists,phCommandLists,hFence);
  }
  return pfnExecuteCommandLists._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandQueueExecuteCommandLists(
        ze_command_queue_handle_t hCommandQueue,        ///< [in] handle of the command queue
        uint32_t numCommandLists,                       ///< [in] number of command lists to execute
        ze_command_list_handle_t* phCommandLists,       ///< [in][range(0, numCommandLists)] list of handles of the command lists
                                                        ///< to execute
        ze_fence_handle_t hFence                        ///< [in][optional] handle of the fence to signal on completion
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnExecuteCommandLists = context.zeDdiTable.CommandQueue.pfnExecuteCommandLists;
        if( nullptr != pfnExecuteCommandLists )
        {
            result = pfnExecuteCommandLists( hCommandQueue, numCommandLists, phCommandLists, hFence );
        }
        else
        {
            // generic implementation
        }

        return result;
    }